

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::TextFlow::Column::const_iterator::calcLength(const_iterator *this)

{
  ulong uVar1;
  byte bVar2;
  Column *pCVar3;
  size_t sVar4;
  pointer pcVar5;
  pointer pcVar6;
  void *pvVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  
  this->m_addHyphen = false;
  pCVar3 = this->m_column;
  sVar4 = this->m_lineStart;
  this->m_parsedTo = sVar4;
  pcVar5 = (pCVar3->m_string)._M_dataplus._M_p;
  sVar10 = sVar4;
  if (pcVar5[sVar4] == '\n') {
    sVar10 = sVar4 + 1;
    this->m_parsedTo = sVar10;
  }
  if ((sVar4 != 0) || (sVar9 = pCVar3->m_initialIndent, sVar9 == 0xffffffffffffffff)) {
    sVar9 = pCVar3->m_indent;
  }
  sVar9 = pCVar3->m_width - sVar9;
  uVar8 = (pCVar3->m_string)._M_string_length;
  uVar1 = sVar9 + sVar4;
  if (uVar1 < uVar8) {
    uVar8 = uVar1;
  }
  uVar11 = sVar10;
  if (sVar10 < uVar8) {
    do {
      uVar11 = sVar10;
      if (pcVar5[sVar10] == '\n') break;
      sVar10 = sVar10 + 1;
      this->m_parsedTo = sVar10;
      uVar11 = uVar8;
    } while (uVar8 != sVar10);
  }
  if (uVar11 < uVar1) {
    sVar10 = uVar11 - sVar4;
    goto LAB_0015a63c;
  }
  if (sVar9 != 0) {
    uVar1 = (pCVar3->m_string)._M_string_length;
    sVar12 = uVar1 - sVar4;
    pcVar6 = (pCVar3->m_string)._M_dataplus._M_p;
    sVar10 = sVar9;
    do {
      if (sVar4 + sVar10 == 0) {
        __assert_fail("at > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                      ,0x1ac1,"bool (anonymous namespace)::isBoundary(const std::string &, size_t)")
        ;
      }
      if (uVar1 < sVar4 + sVar10) {
        __assert_fail("at <= line.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                      ,0x1ac2,"bool (anonymous namespace)::isBoundary(const std::string &, size_t)")
        ;
      }
      if (sVar12 == sVar10) goto joined_r0x0015a613;
      bVar2 = pcVar6[sVar10 + sVar4];
      if (((((ulong)bVar2 < 0x21) && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) &&
          ((0x20 < (ulong)(byte)pcVar6[sVar10 + (sVar4 - 1)] ||
           ((0x100002600U >> ((ulong)(byte)pcVar6[sVar10 + (sVar4 - 1)] & 0x3f) & 1) == 0)))) ||
         ((pvVar7 = memchr("[({<|",(int)(char)bVar2,5), pvVar7 != (void *)0x0 ||
          (pvVar7 = memchr(::(anonymous_namespace)::isBreakableAfter(char)::chars,
                           (int)pcVar6[sVar10 + (sVar4 - 1)],0xf), pvVar7 != (void *)0x0))))
      goto LAB_0015a615;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  goto LAB_0015a62c;
  while( true ) {
    sVar12 = sVar10 - 1;
joined_r0x0015a613:
    sVar10 = sVar12;
    if (sVar10 == 0) break;
LAB_0015a615:
    if ((0x20 < (ulong)(byte)pcVar5[sVar10 + (sVar4 - 1)]) ||
       ((0x100002600U >> ((ulong)(byte)pcVar5[sVar10 + (sVar4 - 1)] & 0x3f) & 1) == 0))
    goto LAB_0015a63c;
  }
LAB_0015a62c:
  this->m_addHyphen = true;
  sVar10 = sVar9 - 1;
LAB_0015a63c:
  this->m_lineLength = sVar10;
  return;
}

Assistant:

void Column::const_iterator::calcLength() {
            m_addHyphen = false;
            m_parsedTo = m_lineStart;

            std::string const& current_line = m_column.m_string;
            if ( current_line[m_lineStart] == '\n' ) {
                ++m_parsedTo;
            }

            const auto maxLineLength = m_column.m_width - indentSize();
            const auto maxParseTo = std::min(current_line.size(), m_lineStart + maxLineLength);
            while ( m_parsedTo < maxParseTo &&
                    current_line[m_parsedTo] != '\n' ) {
                ++m_parsedTo;
            }

            // If we encountered a newline before the column is filled,
            // then we linebreak at the newline and consider this line
            // finished.
            if ( m_parsedTo < m_lineStart + maxLineLength ) {
                m_lineLength = m_parsedTo - m_lineStart;
            } else {
                // Look for a natural linebreak boundary in the column
                // (We look from the end, so that the first found boundary is
                // the right one)
                size_t newLineLength = maxLineLength;
                while ( newLineLength > 0 && !isBoundary( current_line, m_lineStart + newLineLength ) ) {
                    --newLineLength;
                }
                while ( newLineLength > 0 &&
                        isWhitespace( current_line[m_lineStart + newLineLength - 1] ) ) {
                    --newLineLength;
                }

                // If we found one, then that is where we linebreak
                if ( newLineLength > 0 ) {
                    m_lineLength = newLineLength;
                } else {
                    // Otherwise we have to split text with a hyphen
                    m_addHyphen = true;
                    m_lineLength = maxLineLength - 1;
                }
            }
        }